

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

Var __thiscall Glucose::SimpSolver::newVar(SimpSolver *this,bool sign,bool dvar)

{
  byte bVar1;
  Var VVar2;
  byte bVar3;
  byte in_DL;
  byte in_SIL;
  int *in_RDI;
  Var v;
  bool in_stack_0000006e;
  bool in_stack_0000006f;
  Solver *in_stack_00000070;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  uint in_stack_ffffffffffffffec;
  int n;
  undefined2 in_stack_fffffffffffffff4;
  
  bVar3 = in_SIL & 1;
  bVar1 = in_DL & 1;
  VVar2 = Solver::newVar(in_stack_00000070,in_stack_0000006f,in_stack_0000006e);
  in_stack_ffffffffffffffec = in_stack_ffffffffffffffec & 0xffffff;
  vec<char>::push((vec<char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (char *)in_RDI);
  n = CONCAT13((char)(in_stack_ffffffffffffffec >> 0x18),(uint3)(ushort)in_stack_ffffffffffffffec);
  vec<char>::push((vec<char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (char *)in_RDI);
  if ((*(byte *)(in_RDI + 0x134) & 1) != 0) {
    vec<int>::push((vec<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI)
    ;
    uVar4 = 0;
    vec<int>::push((vec<int> *)(ulong)in_stack_ffffffffffffffe0,in_RDI);
    OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::init
              ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
               (in_RDI + 0x13e),(EVP_PKEY_CTX *)&stack0xfffffffffffffff0);
    vec<char>::push((vec<char> *)(CONCAT44(uVar4,in_stack_ffffffffffffffe0) & 0xffffffff00ffffff),
                    (char *)in_RDI);
    Heap<Glucose::SimpSolver::ElimLt>::insert
              ((Heap<Glucose::SimpSolver::ElimLt> *)
               CONCAT17(bVar3,CONCAT16(bVar1,CONCAT24(in_stack_fffffffffffffff4,VVar2))),n);
  }
  return VVar2;
}

Assistant:

Var SimpSolver::newVar(bool sign, bool dvar) {
    Var v = Solver::newVar(sign, dvar);
    frozen    .push((char)false);
    eliminated.push((char)false);

    if (use_simplification){
        n_occ     .push(0);
        n_occ     .push(0);
        occurs    .init(v);
        touched   .push(0);
        elim_heap .insert(v);
    }
    return v; }